

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

Status absl::lts_20250127::ErrnoToStatus(int error_number,string_view message)

{
  StatusCode code;
  size_t in_RCX;
  undefined4 in_register_0000003c;
  Status *this;
  char *in_R8;
  string_view message_00;
  string local_58;
  string_view local_38;
  uint local_24;
  char *pcStack_20;
  int error_number_local;
  string_view message_local;
  
  this = (Status *)CONCAT44(in_register_0000003c,error_number);
  pcStack_20 = message._M_str;
  local_24 = (uint)message._M_len;
  message_local._M_len = in_RCX;
  message_local._M_str = (char *)this;
  code = ErrnoToStatusCode(local_24);
  message_00._M_str = in_R8;
  message_00._M_len = message_local._M_len;
  (anonymous_namespace)::MessageForErrnoToStatus_abi_cxx11_
            (&local_58,(void *)(ulong)local_24,(int)pcStack_20,message_00);
  local_38 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  Status::Status(this,code,local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return (Status)(uintptr_t)this;
}

Assistant:

Status ErrnoToStatus(int error_number, absl::string_view message) {
  return Status(ErrnoToStatusCode(error_number),
                MessageForErrnoToStatus(error_number, message));
}